

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::DrawXFB::checkFramebuffer
          (DrawXFB *this,GLfloat r,GLfloat g,GLfloat b,GLfloat a)

{
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar3;
  allocator_type local_39;
  GLfloat local_38;
  GLfloat local_34;
  GLfloat local_30;
  GLfloat local_2c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  
  local_38 = r;
  local_34 = g;
  local_30 = b;
  local_2c = a;
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&pixels,0x10,&local_39);
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1220))
            (0,0,2,2,0x1908,0x1401,
             pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1235);
  uVar1 = 0;
  while (((uVar3 = uVar1, uVar3 != 4 &&
          (pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3 * 4] == (uchar)(int)(local_38 * 255.0))) &&
         (pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3 * 4 + 1] == (uchar)(int)(local_34 * 255.0)))) {
    if ((pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3 * 4 + 2] != (uchar)(int)(local_30 * 255.0)) ||
       (uVar1 = uVar3 + 1,
       pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[uVar3 * 4 + 3] != (uchar)(int)(local_2c * 255.0))) break;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 3 < uVar3;
}

Assistant:

bool gl3cts::TransformFeedback::DrawXFB::checkFramebuffer(glw::GLfloat r, glw::GLfloat g, glw::GLfloat b,
														  glw::GLfloat a)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Number of pixels. */
	const glw::GLuint number_of_pixels = s_view_size * s_view_size;

	/* Fetch framebuffer. */
	std::vector<glw::GLubyte> pixels(number_of_pixels * 4 /* components */);

	if ((s_view_size > 0) && (s_view_size > 0))
	{
		gl.readPixels(0, 0, s_view_size, s_view_size, GL_RGBA, GL_UNSIGNED_BYTE, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Convert color to integer. */
	glw::GLubyte ir = (glw::GLubyte)(255.f * r);
	glw::GLubyte ig = (glw::GLubyte)(255.f * g);
	glw::GLubyte ib = (glw::GLubyte)(255.f * b);
	glw::GLubyte ia = (glw::GLubyte)(255.f * a);

	/* Check results. */
	for (glw::GLuint i = 0; i < number_of_pixels; ++i)
	{
		if ((pixels[i * 4 /* components */] != ir) || (pixels[i * 4 /* components */ + 1] != ig) ||
			(pixels[i * 4 /* components */ + 2] != ib) || (pixels[i * 4 /* components */ + 3] != ia))
		{
			return false;
		}
	}

	return true;
}